

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBrVar(WatWriter *this,Var *var,NextChar next_char)

{
  string *str;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  Var *__s;
  
  if (var->type_ != Index) {
    str = Var::name_abi_cxx11_(var);
    WriteString(this,str,next_char);
    return;
  }
  __s = var;
  pcVar1 = Var::index(var,(char *)var,next_char);
  lVar2 = (long)(this->super_ModuleContext).label_stack_.
                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_ModuleContext).label_stack_.
                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                super__Vector_impl_data._M_start;
  pcVar3 = Var::index(var,(char *)__s,(int)(lVar2 % 0x58));
  if ((uint)pcVar1 < (uint)(lVar2 / 0x58)) {
    lVar2 = (long)(this->super_ModuleContext).label_stack_.
                  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_ModuleContext).label_stack_.
                  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pcVar1 = Var::index(var,(char *)__s,(int)(lVar2 % 0x58));
    Writef(this,"%u (;@%u;)",(ulong)pcVar3 & 0xffffffff,(ulong)((int)(lVar2 / 0x58) + ~(uint)pcVar1)
          );
  }
  else {
    Writef(this,"%u (; INVALID ;)",(ulong)pcVar3 & 0xffffffff);
  }
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteBrVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    if (var.index() < GetLabelStackSize()) {
      Writef("%" PRIindex " (;@%" PRIindex ";)", var.index(),
             GetLabelStackSize() - var.index() - 1);
    } else {
      Writef("%" PRIindex " (; INVALID ;)", var.index());
    }
    next_char_ = next_char;
  } else {
    WriteString(var.name(), next_char);
  }
}